

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

void opj_tcd_makelayer(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_FLOAT64 thresh,OPJ_UINT32 final)

{
  opj_tcd_cblk_enc_t *poVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  opj_tcd_tile_t *poVar6;
  opj_tcd_tilecomp_t *poVar7;
  opj_tcd_resolution_t *poVar8;
  opj_tcd_precinct_t *poVar9;
  opj_tcd_cblk_enc_t *poVar10;
  opj_tcd_pass_t *poVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  OPJ_FLOAT64 *pOVar21;
  uint uVar22;
  opj_tcd_layer_t *poVar23;
  ulong uVar24;
  double dVar25;
  OPJ_FLOAT64 OVar26;
  ulong local_a0;
  
  poVar6 = tcd->tcd_image->tiles;
  poVar6->distolayer[layno] = 0.0;
  uVar2 = poVar6->numcomps;
  if ((ulong)uVar2 != 0) {
    poVar7 = poVar6->comps;
    uVar16 = 0;
    do {
      uVar18 = (ulong)poVar7[uVar16].numresolutions;
      if (uVar18 != 0) {
        poVar8 = poVar7[uVar16].resolutions;
        uVar15 = 0;
        do {
          uVar3 = poVar8[uVar15].numbands;
          if ((ulong)uVar3 != 0) {
            uVar19 = (ulong)(poVar8[uVar15].ph * poVar8[uVar15].pw);
            local_a0 = 0;
            do {
              if (uVar19 != 0) {
                poVar9 = poVar8[uVar15].bands[local_a0].precincts;
                uVar14 = 0;
                do {
                  uVar13 = poVar9[uVar14].ch * poVar9[uVar14].cw;
                  if (uVar13 != 0) {
                    uVar24 = 0;
                    do {
                      poVar10 = poVar9[uVar14].cblks.enc;
                      poVar1 = poVar10 + uVar24;
                      if (layno == 0) {
                        poVar1->numpassesinlayers = 0;
                      }
                      uVar4 = poVar1->numpassesinlayers;
                      uVar20 = (ulong)uVar4;
                      uVar17 = uVar4;
                      if (uVar4 < poVar1->totalpasses) {
                        poVar11 = poVar1->passes;
                        pOVar21 = &poVar11[uVar20].distortiondec;
                        uVar22 = uVar4;
                        do {
                          uVar17 = ((opj_tcd_pass_t *)(pOVar21 + -1))->rate;
                          if (uVar22 == 0) {
                            dVar25 = (double)*pOVar21;
                          }
                          else {
                            uVar17 = uVar17 - poVar11[uVar22 - 1].rate;
                            dVar25 = (double)*pOVar21 - (double)poVar11[uVar22 - 1].distortiondec;
                          }
                          if (uVar17 == 0) {
                            bVar12 = dVar25 != 0.0;
                          }
                          else {
                            bVar12 = (double)thresh - dVar25 / (double)uVar17 <
                                     2.220446049250313e-16;
                          }
                          uVar20 = uVar20 + 1;
                          uVar17 = (uint)uVar20;
                          if (!bVar12) {
                            uVar17 = uVar22;
                          }
                          pOVar21 = pOVar21 + 3;
                          uVar22 = uVar17;
                        } while (poVar1->totalpasses != uVar20);
                      }
                      poVar23 = poVar10[uVar24].layers + layno;
                      poVar23->numpasses = uVar17 - uVar4;
                      if (uVar17 - uVar4 == 0) {
                        poVar23->disto = 0.0;
                      }
                      else {
                        uVar22 = uVar17 - 1;
                        poVar11 = poVar1->passes;
                        if (uVar4 == 0) {
                          poVar23->len = poVar11[uVar22].rate;
                          poVar23->data = poVar1->data;
                          OVar26 = poVar11[uVar22].distortiondec;
                        }
                        else {
                          uVar5 = poVar11[uVar4 - 1].rate;
                          poVar23->len = poVar11[uVar22].rate - uVar5;
                          poVar23->data = poVar1->data + uVar5;
                          OVar26 = (OPJ_FLOAT64)
                                   ((double)poVar11[uVar22].distortiondec -
                                   (double)poVar11[uVar4 - 1].distortiondec);
                        }
                        poVar23->disto = OVar26;
                        poVar6->distolayer[layno] =
                             (OPJ_FLOAT64)((double)OVar26 + (double)poVar6->distolayer[layno]);
                        if (final != 0) {
                          poVar1->numpassesinlayers = uVar17;
                        }
                      }
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != uVar13);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 != uVar19);
              }
              local_a0 = local_a0 + 1;
            } while (local_a0 != uVar3);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar18);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar2);
  }
  return;
}

Assistant:

void opj_tcd_makelayer( opj_tcd_t *tcd,
                                                OPJ_UINT32 layno,
                                                OPJ_FLOAT64 thresh,
                                                OPJ_UINT32 final)
{
        OPJ_UINT32 compno, resno, bandno, precno, cblkno;
        OPJ_UINT32 passno;

        opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;

        tcd_tile->distolayer[layno] = 0;        /* fixed_quality */

        for (compno = 0; compno < tcd_tile->numcomps; compno++) {
                opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

                for (resno = 0; resno < tilec->numresolutions; resno++) {
                        opj_tcd_resolution_t *res = &tilec->resolutions[resno];

                        for (bandno = 0; bandno < res->numbands; bandno++) {
                                opj_tcd_band_t *band = &res->bands[bandno];

                                for (precno = 0; precno < res->pw * res->ph; precno++) {
                                        opj_tcd_precinct_t *prc = &band->precincts[precno];

                                        for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                                                opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                                                opj_tcd_layer_t *layer = &cblk->layers[layno];
                                                OPJ_UINT32 n;

                                                if (layno == 0) {
                                                        cblk->numpassesinlayers = 0;
                                                }

                                                n = cblk->numpassesinlayers;

                                                for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
                                                        OPJ_UINT32 dr;
                                                        OPJ_FLOAT64 dd;
                                                        opj_tcd_pass_t *pass = &cblk->passes[passno];

                                                        if (n == 0) {
                                                                dr = pass->rate;
                                                                dd = pass->distortiondec;
                                                        } else {
                                                                dr = pass->rate - cblk->passes[n - 1].rate;
                                                                dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
                                                        }

                                                        if (!dr) {
                                                                if (dd != 0)
                                                                        n = passno + 1;
                                                                continue;
                                                        }
                                                        if (thresh - (dd / dr) < DBL_EPSILON) /* do not rely on float equality, check with DBL_EPSILON margin */
                                                                n = passno + 1;
                                                }

                                                layer->numpasses = n - cblk->numpassesinlayers;

                                                if (!layer->numpasses) {
                                                        layer->disto = 0;
                                                        continue;
                                                }

                                                if (cblk->numpassesinlayers == 0) {
                                                        layer->len = cblk->passes[n - 1].rate;
                                                        layer->data = cblk->data;
                                                        layer->disto = cblk->passes[n - 1].distortiondec;
                                                } else {
                                                        layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers - 1].rate;
                                                        layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                                                        layer->disto = cblk->passes[n - 1].distortiondec - cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
                                                }

                                                tcd_tile->distolayer[layno] += layer->disto;    /* fixed_quality */

                                                if (final)
                                                        cblk->numpassesinlayers = n;
                                        }
                                }
                        }
                }
        }
}